

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void decompressBlockPlanar57c
               (uint compressed57_1,uint compressed57_2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint8 uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  
  uVar13 = compressed57_1 >> 0x12 & 0xfe;
  uVar6 = compressed57_1 >> 0xb & 0xfc;
  uVar15 = compressed57_1 >> 0x11 & 3;
  iVar11 = (compressed57_1 >> 9 & 0x3f0) + uVar15 * 4 + 2;
  uVar9 = compressed57_1 >> 0x19 & 1;
  iVar17 = (compressed57_1 >> 0x10 & 0x3f8) + uVar9 * 4 + 2;
  uVar1 = compressed57_1 >> 0x18 & 0xfffffffc;
  uVar7 = compressed57_1 >> 0x1e;
  iVar2 = (width * starty + startx) * channels;
  iVar12 = (compressed57_1 >> 0x16 & 0xfffffff0) + uVar7 * 4 + 2;
  for (iVar14 = 0; iVar14 != 4; iVar14 = iVar14 + 1) {
    lVar16 = 4;
    iVar18 = iVar17;
    iVar10 = iVar11;
    iVar3 = iVar2;
    iVar8 = iVar12;
    while (bVar19 = lVar16 != 0, lVar16 = lVar16 + -1, bVar19) {
      iVar5 = iVar8 >> 2;
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      img[iVar3] = (uint8)iVar5;
      iVar5 = iVar18 >> 2;
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      uVar4 = (uint8)iVar5;
      if (iVar5 < 1) {
        uVar4 = '\0';
      }
      img[(long)iVar3 + 1] = uVar4;
      iVar5 = iVar10 >> 2;
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      uVar4 = (uint8)iVar5;
      if (iVar5 < 1) {
        uVar4 = '\0';
      }
      img[(long)iVar3 + 2] = uVar4;
      iVar3 = iVar3 + channels * width;
      iVar10 = iVar10 + (((compressed57_2 >> 0xb & 3 | compressed57_2 >> 5 & 0xfc) - uVar15) - uVar6
                        );
      iVar18 = iVar18 + (((compressed57_2 >> 0x13 & 1 | compressed57_2 >> 0xc & 0xfe) - uVar9) -
                        uVar13);
      iVar8 = iVar8 + (((compressed57_2 >> 0x18 & 3 | compressed57_2 >> 0x12 & 0xfc) - uVar7) -
                      uVar1);
    }
    iVar2 = iVar2 + channels;
    iVar11 = iVar11 + (((compressed57_2 >> 0x1e | compressed57_2 >> 0x18 & 0xfffffffc) - uVar15) -
                      uVar6);
    iVar17 = iVar17 + (((((compressed57_1 & 0x7f) >> 6) + (compressed57_1 & 0x7f) * 2) - uVar9) -
                      uVar13);
    iVar12 = iVar12 + (((compressed57_1 >> 0xb & 3 | compressed57_1 >> 5 & 0xfc) - uVar7) - uVar1);
  }
  return;
}

Assistant:

void decompressBlockPlanar57c(unsigned int compressed57_1, unsigned int compressed57_2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	uint8 colorO[3], colorH[3], colorV[3];

	colorO[0] = GETBITSHIGH( compressed57_1, 6, 63);
	colorO[1] = GETBITSHIGH( compressed57_1, 7, 57);
	colorO[2] = GETBITSHIGH( compressed57_1, 6, 50);
	colorH[0] = GETBITSHIGH( compressed57_1, 6, 44);
	colorH[1] = GETBITSHIGH( compressed57_1, 7, 38);
	colorH[2] = GETBITS(     compressed57_2, 6, 31);
	colorV[0] = GETBITS(     compressed57_2, 6, 25);
	colorV[1] = GETBITS(     compressed57_2, 7, 19);
	colorV[2] = GETBITS(     compressed57_2, 6, 12);

	colorO[0] = (colorO[0] << 2) | (colorO[0] >> 4);
	colorO[1] = (colorO[1] << 1) | (colorO[1] >> 6);
	colorO[2] = (colorO[2] << 2) | (colorO[2] >> 4);

	colorH[0] = (colorH[0] << 2) | (colorH[0] >> 4);
	colorH[1] = (colorH[1] << 1) | (colorH[1] >> 6);
	colorH[2] = (colorH[2] << 2) | (colorH[2] >> 4);

	colorV[0] = (colorV[0] << 2) | (colorV[0] >> 4);
	colorV[1] = (colorV[1] << 1) | (colorV[1] >> 6);
	colorV[2] = (colorV[2] << 2) | (colorV[2] >> 4);

	int xx, yy;

	for( xx=0; xx<4; xx++)
	{
		for( yy=0; yy<4; yy++)
		{
			img[channels*width*(starty+yy) + channels*(startx+xx) + 0] = CLAMP(0, ((xx*(colorH[0]-colorO[0]) + yy*(colorV[0]-colorO[0]) + 4*colorO[0] + 2) >> 2),255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 1] = CLAMP(0, ((xx*(colorH[1]-colorO[1]) + yy*(colorV[1]-colorO[1]) + 4*colorO[1] + 2) >> 2),255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 2] = CLAMP(0, ((xx*(colorH[2]-colorO[2]) + yy*(colorV[2]-colorO[2]) + 4*colorO[2] + 2) >> 2),255);

			//Equivalent method
			/*img[channels*width*(starty+yy) + channels*(startx+xx) + 0] = (int)CLAMP(0, JAS_ROUND((xx*(colorH[0]-colorO[0])/4.0 + yy*(colorV[0]-colorO[0])/4.0 + colorO[0])), 255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 1] = (int)CLAMP(0, JAS_ROUND((xx*(colorH[1]-colorO[1])/4.0 + yy*(colorV[1]-colorO[1])/4.0 + colorO[1])), 255);
			img[channels*width*(starty+yy) + channels*(startx+xx) + 2] = (int)CLAMP(0, JAS_ROUND((xx*(colorH[2]-colorO[2])/4.0 + yy*(colorV[2]-colorO[2])/4.0 + colorO[2])), 255);*/
			
		}
	}
}